

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom
          (ArrayFeatureType_EnumeratedShapes *this,ArrayFeatureType_EnumeratedShapes *from)

{
  void *pvVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/FeatureTypes.pb.cc"
               ,0x9ec);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
            (&(this->shapes_).super_RepeatedPtrFieldBase,&(from->shapes_).super_RepeatedPtrFieldBase
            );
  return;
}

Assistant:

void ArrayFeatureType_EnumeratedShapes::MergeFrom(const ArrayFeatureType_EnumeratedShapes& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType.EnumeratedShapes)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shapes_.MergeFrom(from.shapes_);
}